

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Glucose::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  uint *puVar1;
  int iVar2;
  char *pcVar3;
  VarData *pVVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Lit p_1;
  Lit local_40;
  Lit local_3c;
  vec<Glucose::Lit> *local_38;
  
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_3c.x = p.x;
  vec<Glucose::Lit>::push(&this->analyze_stack,&local_3c);
  uVar7 = (this->analyze_stack).sz;
  if (0 < (int)uVar7) {
    local_38 = &this->analyze_toclear;
    iVar2 = (this->analyze_toclear).sz;
    lVar10 = (long)iVar2;
    do {
      puVar1 = (this->ca).super_RegionAllocator<unsigned_int>.memory +
               (this->vardata).data[(this->analyze_stack).data[(ulong)uVar7 - 1].x >> 1].reason;
      (this->analyze_stack).sz = uVar7 - 1;
      lVar5 = *(long *)puVar1;
      iVar6 = (int)((ulong)lVar5 >> 0x20);
      if ((iVar6 == 2) &&
         (uVar7 = puVar1[3], ((byte)uVar7 & 1 ^ (this->assigns).data[(int)uVar7 >> 1].value) == 1))
      {
        puVar1[3] = puVar1[4];
        puVar1[4] = uVar7;
      }
      if (1 < iVar6) {
        lVar8 = 4;
        do {
          local_40.x = puVar1[lVar8];
          iVar6 = local_40.x >> 1;
          pcVar3 = (this->seen).data;
          if (pcVar3[iVar6] == '\0') {
            pVVar4 = (this->vardata).data;
            uVar7 = pVVar4[iVar6].level;
            if (0 < (int)uVar7) {
              if ((pVVar4[iVar6].reason == 0xffffffff) ||
                 ((abstract_levels >> (uVar7 & 0x1f) & 1) == 0)) {
                iVar6 = (this->analyze_toclear).sz;
                if (iVar2 < iVar6) {
                  do {
                    (this->seen).data[(this->analyze_toclear).data[lVar10].x >> 1] = '\0';
                    lVar10 = lVar10 + 1;
                    iVar6 = (this->analyze_toclear).sz;
                  } while (lVar10 < iVar6);
                }
                if (iVar2 < iVar6) {
                  (this->analyze_toclear).sz = iVar2;
                }
                return false;
              }
              pcVar3[iVar6] = '\x01';
              vec<Glucose::Lit>::push(&this->analyze_stack,&local_40);
              vec<Glucose::Lit>::push(local_38,&local_40);
              lVar5 = *(long *)puVar1;
            }
          }
          lVar9 = lVar8 + -2;
          lVar8 = lVar8 + 1;
        } while (lVar9 < lVar5 >> 0x20);
      }
      uVar7 = (this->analyze_stack).sz;
    } while (0 < (int)uVar7);
  }
  return true;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels) {
    analyze_stack.clear();
    analyze_stack.push(p);
    int top = analyze_toclear.size();
    while(analyze_stack.size() > 0) {
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause &c = ca[reason(var(analyze_stack.last()))];
        analyze_stack.pop(); //
        if(c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        for(int i = 1; i < c.size(); i++) {
            Lit p = c[i];
            if(!seen[var(p)]) {
                if(level(var(p)) > 0) {
                    if(reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0) {
                        seen[var(p)] = 1;
                        analyze_stack.push(p);
                        analyze_toclear.push(p);
                    } else {
                        for(int j = top; j < analyze_toclear.size(); j++)
                            seen[var(analyze_toclear[j])] = 0;
                        analyze_toclear.shrink(analyze_toclear.size() - top);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}